

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::Generate
          (ImmutableMessageGenerator *this,Printer *printer)

{
  key_type *args_3;
  ImmutableExtensionGenerator *this_00;
  size_type *psVar1;
  Descriptor **ppDVar2;
  size_t *psVar3;
  char cVar4;
  char *pcVar5;
  Context *context;
  long lVar6;
  pointer pcVar7;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  _Var8;
  Printer *pPVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  JavaType type;
  mapped_type *pmVar13;
  LogMessage *pLVar14;
  long *plVar15;
  _Rb_tree_node_base *p_Var16;
  long lVar17;
  Descriptor *pDVar18;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  ImmutableMessageGenerator *extraout_RDX_01;
  ImmutableMessageGenerator *extraout_RDX_02;
  ImmutableMessageGenerator *extraout_RDX_03;
  ImmutableMessageGenerator *pIVar19;
  _func_int **pp_Var20;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_06;
  char *pcVar21;
  uint uVar22;
  char *pcVar23;
  long lVar24;
  long lVar25;
  SubstituteArg local_340;
  SubstituteArg local_310;
  SubstituteArg local_2e0;
  undefined8 local_2b0;
  undefined4 local_2a8;
  char *local_280;
  undefined8 local_278;
  char local_270 [16];
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  SubstituteArg local_240;
  undefined1 local_210 [8];
  string builder_type;
  undefined4 local_1e8;
  undefined2 local_1e0;
  undefined1 local_1de;
  long local_1d0;
  _Rb_tree_node_base *local_1c8;
  _Rb_tree_node_base *local_1c0;
  SubstituteArg local_1b8;
  undefined1 local_180 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string out_1;
  undefined1 local_f0 [8];
  ImmutableMessageGenerator messageGenerator;
  long local_78;
  undefined8 local_48;
  ImmutableMessageGenerator *local_40;
  Printer *local_38;
  
  pDVar18 = (this->super_MessageGenerator).descriptor_;
  pcVar21 = "";
  if (*(long *)(pDVar18 + 0x18) == 0) {
    pcVar23 = "static ";
    if (*(char *)(*(long *)(*(long *)(pDVar18 + 0x10) + 0x88) + 0x98) != '\0') {
      pcVar23 = "";
    }
  }
  else {
    pcVar23 = "static ";
  }
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&variables;
  variables._M_t._M_impl._0_4_ = 0;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_f0 = (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_40 = this;
  local_38 = printer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"static","");
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_180,(key_type *)local_f0);
  pcVar5 = (char *)pmVar13->_M_string_length;
  strlen(pcVar23);
  std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar5,(ulong)pcVar23);
  if (local_f0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
    operator_delete((void *)local_f0);
  }
  local_f0 = (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"classname","");
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_180,(key_type *)local_f0);
  std::__cxx11::string::_M_assign((string *)pmVar13);
  pDVar18 = extraout_RDX;
  if (local_f0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
    operator_delete((void *)local_f0);
    pDVar18 = extraout_RDX_00;
  }
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)local_f0,(java *)(local_40->super_MessageGenerator).descriptor_,pDVar18);
  pcVar23 = local_1b8.scratch_ + 4;
  local_1b8.text_ = pcVar23;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"extra_interfaces","");
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_180,(key_type *)&local_1b8);
  std::__cxx11::string::operator=((string *)pmVar13,(string *)local_f0);
  if (local_1b8.text_ != pcVar23) {
    operator_delete(local_1b8.text_);
  }
  if (local_f0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
    operator_delete((void *)local_f0);
  }
  local_f0 = (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_;
  messageGenerator.super_MessageGenerator.descriptor_._0_2_ = 0x3356;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)0x2;
  messageGenerator.super_MessageGenerator.descriptor_._2_1_ = 0;
  local_1b8.text_ = pcVar23;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"ver","");
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_180,(key_type *)&local_1b8);
  std::__cxx11::string::operator=((string *)pmVar13,(string *)local_f0);
  if (local_1b8.text_ != pcVar23) {
    operator_delete(local_1b8.text_);
  }
  if (local_f0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
    operator_delete((void *)local_f0);
  }
  if (*(char *)(*(long *)((local_40->super_MessageGenerator).descriptor_ + 0x20) + 0x4a) != '\0') {
    pcVar21 = "@java.lang.Deprecated ";
  }
  local_f0 = (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"deprecation","");
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_180,(key_type *)local_f0);
  std::__cxx11::string::_M_replace
            ((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,(ulong)pcVar21);
  if (local_f0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
    operator_delete((void *)local_f0);
  }
  pIVar19 = local_40;
  WriteMessageDocComment(local_38,(local_40->super_MessageGenerator).descriptor_);
  pDVar18 = (pIVar19->super_MessageGenerator).descriptor_;
  context = pIVar19->context_;
  local_f0 = (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"");
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,local_38,pDVar18,true,(string *)local_f0);
  if (local_f0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
    operator_delete((void *)local_f0);
  }
  pPVar9 = local_38;
  local_210 = (undefined1  [8])&builder_type._M_string_length;
  builder_type._M_dataplus._M_p = (pointer)0x0;
  builder_type._M_string_length._0_1_ = 0;
  if (*(int *)((local_40->super_MessageGenerator).descriptor_ + 0x7c) < 1) {
    google::protobuf::io::Printer::Print((map *)local_38,local_180);
    io::Printer::Annotate<google::protobuf::Descriptor>
              (pPVar9,"classname","classname",(local_40->super_MessageGenerator).descriptor_);
    google::protobuf::io::Printer::Print((map *)pPVar9,local_180);
    local_1e0 = 0x3356;
    local_1de = 0;
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
         (_func_int **)
         CONCAT44(messageGenerator.super_MessageGenerator._vptr_MessageGenerator._4_4_,2);
    local_1b8.text_ = (char *)0x0;
    local_1b8.size_ = -1;
    messageGenerator.field_generators_.field_generators_.
    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vars._M_t._M_impl._0_4_ = 0xffffffff;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    out_1._M_dataplus._M_p._0_4_ = 0xffffffff;
    local_240.text_ = (char *)0x0;
    local_240.size_ = -1;
    local_340.text_ = (char *)0x0;
    local_340.size_ = -1;
    local_310.text_ = (char *)0x0;
    local_310.size_ = -1;
    local_2e0.text_ = (char *)0x0;
    local_2e0.size_ = -1;
    local_2b0 = 0;
    local_2a8 = 0xffffffff;
    builder_type.field_2._8_8_ = &stack0xfffffffffffffe20;
    local_f0 = (undefined1  [8])&stack0xfffffffffffffe20;
    google::protobuf::strings::Substitute_abi_cxx11_
              ((char *)local_260,
               (SubstituteArg *)"com.google.protobuf.GeneratedMessage$0.Builder<?>",
               (SubstituteArg *)local_f0,&local_1b8,
               (SubstituteArg *)
               &messageGenerator.field_generators_.field_generators_.
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (SubstituteArg *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (SubstituteArg *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_240,
               &local_340,&local_310,&local_2e0);
    std::__cxx11::string::operator=((string *)local_210,(string *)local_260);
    if (local_260[0] != local_250) {
      operator_delete(local_260[0]);
    }
    if ((undefined2 *)builder_type.field_2._8_8_ == &stack0xfffffffffffffe20) goto LAB_0021c377;
  }
  else {
    google::protobuf::io::Printer::Print((map *)local_38,local_180);
    io::Printer::Annotate<google::protobuf::Descriptor>
              (pPVar9,"classname","classname",(local_40->super_MessageGenerator).descriptor_);
    google::protobuf::io::Printer::Print((map *)pPVar9,local_180);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)((long)&builder_type.field_2 + 8),local_40->name_resolver_,
               (local_40->super_MessageGenerator).descriptor_,true);
    local_f0 = (undefined1  [8])builder_type.field_2._8_8_;
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
         (_func_int **)
         CONCAT44(messageGenerator.super_MessageGenerator._vptr_MessageGenerator._4_4_,local_1e8);
    local_270[0] = 'V';
    local_270[1] = '3';
    local_278 = 2;
    local_270[2] = 0;
    local_1b8.size_ = 2;
    messageGenerator.field_generators_.field_generators_.
    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vars._M_t._M_impl._0_4_ = 0xffffffff;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    out_1._M_dataplus._M_p._0_4_ = 0xffffffff;
    local_240.text_ = (char *)0x0;
    local_240.size_ = -1;
    local_340.text_ = (char *)0x0;
    local_340.size_ = -1;
    local_310.text_ = (char *)0x0;
    local_310.size_ = -1;
    local_2e0.text_ = (char *)0x0;
    local_2e0.size_ = -1;
    local_2b0 = 0;
    local_2a8 = 0xffffffff;
    local_280 = local_270;
    local_1b8.text_ = local_270;
    google::protobuf::strings::Substitute_abi_cxx11_
              ((char *)local_260,
               (SubstituteArg *)"com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
               (SubstituteArg *)local_f0,&local_1b8,
               (SubstituteArg *)
               &messageGenerator.field_generators_.field_generators_.
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (SubstituteArg *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (SubstituteArg *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_240,
               &local_340,&local_310,&local_2e0);
    std::__cxx11::string::operator=((string *)local_210,(string *)local_260);
    if (local_260[0] != local_250) {
      operator_delete(local_260[0]);
    }
    if (local_280 != local_270) {
      operator_delete(local_280);
    }
    if ((undefined2 *)builder_type.field_2._8_8_ == &stack0xfffffffffffffe20) goto LAB_0021c377;
  }
  operator_delete((void *)builder_type.field_2._8_8_);
LAB_0021c377:
  pPVar9 = local_38;
  local_78 = CONCAT44(local_78._4_4_,0xffffffff);
  io::Printer::Print<>(local_38,"private static final long serialVersionUID = 0L;\n");
  google::protobuf::io::Printer::Indent();
  io::Printer::Print<char[10],std::__cxx11::string,char[12],std::__cxx11::string>
            (pPVar9,
             "// Use $classname$.newBuilder() to construct.\nprivate $classname$($buildertype$ builder) {\n  super(builder);\n}\n"
             ,(char (*) [10])0x29599a,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (local_40->super_MessageGenerator).descriptor_,(char (*) [12])"buildertype",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
  io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar9,"private $classname$() {\n",(char (*) [10])0x29599a,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (local_40->super_MessageGenerator).descriptor_);
  google::protobuf::io::Printer::Indent();
  GenerateInitializers(local_40,pPVar9);
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>(pPVar9,"}\n\n");
  google::protobuf::io::Printer::Print((map *)pPVar9,local_180);
  io::Printer::Print<>
            (pPVar9,
             "@java.lang.Override\npublic final com.google.protobuf.UnknownFieldSet\ngetUnknownFields() {\n  return this.unknownFields;\n}\n"
            );
  bVar10 = Context::HasGeneratedMethods
                     (local_40->context_,(local_40->super_MessageGenerator).descriptor_);
  if (bVar10) {
    GenerateParsingConstructor(local_40,pPVar9);
  }
  GenerateDescriptorMethods(local_40,pPVar9);
  pDVar18 = (local_40->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar18 + 0x78)) {
    lVar24 = 0;
    lVar25 = 0;
    do {
      EnumGenerator::EnumGenerator
                ((EnumGenerator *)local_f0,(EnumDescriptor *)(*(long *)(pDVar18 + 0x40) + lVar24),
                 true,local_40->context_);
      EnumGenerator::Generate((EnumGenerator *)local_f0,local_38);
      EnumGenerator::~EnumGenerator((EnumGenerator *)local_f0);
      lVar25 = lVar25 + 1;
      pDVar18 = (local_40->super_MessageGenerator).descriptor_;
      lVar24 = lVar24 + 0x50;
    } while (lVar25 < *(int *)(pDVar18 + 0x78));
  }
  pPVar9 = local_38;
  pDVar18 = (local_40->super_MessageGenerator).descriptor_;
  pIVar19 = local_40;
  if (0 < *(int *)(pDVar18 + 0x74)) {
    lVar24 = 0;
    lVar25 = 0;
    do {
      if (*(char *)(*(long *)(*(long *)(pDVar18 + 0x38) + 0x20 + lVar24) + 0x4b) == '\0') {
        ImmutableMessageGenerator
                  ((ImmutableMessageGenerator *)local_f0,
                   (Descriptor *)(*(long *)(pDVar18 + 0x38) + lVar24),local_40->context_);
        GenerateInterface((ImmutableMessageGenerator *)local_f0,pPVar9);
        Generate((ImmutableMessageGenerator *)local_f0,pPVar9);
        ~ImmutableMessageGenerator((ImmutableMessageGenerator *)local_f0);
        pIVar19 = extraout_RDX_01;
      }
      lVar25 = lVar25 + 1;
      pDVar18 = (local_40->super_MessageGenerator).descriptor_;
      lVar24 = lVar24 + 0x90;
    } while (lVar25 < *(int *)(pDVar18 + 0x74));
  }
  pDVar18 = (local_40->super_MessageGenerator).descriptor_;
  if (*(int *)(pDVar18 + 0x68) < 1) {
    local_48 = (OneofDescriptor *)((ulong)local_48._4_4_ << 0x20);
  }
  else {
    lVar24 = 0;
    lVar25 = 0;
    local_48 = (OneofDescriptor *)((ulong)local_48._4_4_ << 0x20);
    do {
      lVar17 = *(long *)(pDVar18 + 0x28);
      if (*(Descriptor **)(lVar17 + 0x50 + lVar24) != (local_40->field_generators_).descriptor_) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)&local_1b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/compiler/java/java_field.h"
                   ,0x87);
        pLVar14 = (LogMessage *)
                  google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)&local_1b8,
                             "CHECK failed: (field->containing_type()) == (descriptor_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f0,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)&local_1b8);
      }
      if (*(char *)(lVar17 + 0x43 + lVar24) == '\0') {
        plVar15 = (long *)(*(long *)(lVar17 + 0x50 + lVar24) + 0x28);
      }
      else {
        lVar6 = *(long *)(lVar17 + 0x60 + lVar24);
        if (lVar6 == 0) {
          plVar15 = (long *)(*(long *)(lVar17 + 0x28 + lVar24) + 0x80);
        }
        else {
          plVar15 = (long *)(lVar6 + 0x50);
        }
      }
      iVar11 = (**(code **)(*(long *)(local_40->field_generators_).field_generators_.
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [(int)((ulong)((lVar17 - *plVar15) + lVar24) >> 3) * 0x286bca1b
                                     ]._M_t.
                                     super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                     ._M_t + 0x10))();
      local_48 = (OneofDescriptor *)CONCAT44(local_48._4_4_,(int)local_48 + iVar11);
      lVar25 = lVar25 + 1;
      pDVar18 = (local_40->super_MessageGenerator).descriptor_;
      lVar24 = lVar24 + 0x98;
      pIVar19 = local_40;
    } while (lVar25 < *(int *)(pDVar18 + 0x68));
  }
  if (0 < (int)local_48) {
    uVar12 = (int)local_48 + 0x1fU >> 5;
    uVar22 = 1;
    if (1 < uVar12) {
      uVar22 = uVar12;
    }
    uVar12 = 0;
    do {
      GetBitFieldName_abi_cxx11_((string *)local_f0,(java *)(ulong)uVar12,(int)pIVar19);
      io::Printer::Print<char[15],std::__cxx11::string>
                (local_38,"private int $bit_field_name$;\n",(char (*) [15])"bit_field_name",
                 (string *)local_f0);
      pIVar19 = extraout_RDX_02;
      if (local_f0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
        operator_delete((void *)local_f0);
        pIVar19 = extraout_RDX_03;
      }
      uVar12 = uVar12 + 1;
    } while (uVar22 != uVar12);
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
  vars._M_t._M_impl._0_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var16 = (local_40->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_left;
  local_1c0 = &(local_40->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header.
               _M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var16 != local_1c0) {
    psVar1 = &out_1._M_string_length;
    args_3 = (key_type *)
             &messageGenerator.field_generators_.field_generators_.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_48 = *(OneofDescriptor **)(p_Var16 + 1);
      local_1c8 = p_Var16;
      Context::GetOneofGeneratorInfo(local_40->context_,local_48);
      local_f0 = (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"oneof_name","");
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (key_type *)local_f0);
      std::__cxx11::string::_M_assign((string *)pmVar13);
      if (local_f0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
        operator_delete((void *)local_f0);
      }
      Context::GetOneofGeneratorInfo(local_40->context_,local_48);
      local_f0 = (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f0,"oneof_capitalized_name","");
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (key_type *)local_f0);
      std::__cxx11::string::_M_assign((string *)pmVar13);
      if (local_f0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
        operator_delete((void *)local_f0);
      }
      ppDVar2 = &messageGenerator.super_MessageGenerator.descriptor_;
      local_f0 = (undefined1  [8])ppDVar2;
      lVar24 = google::protobuf::FastInt32ToBufferLeft
                         ((int)((ulong)((long)local_48 -
                                       *(long *)(*(long *)(local_48 + 0x10) + 0x30)) >> 4) *
                          -0x55555555,(char *)ppDVar2);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)(lVar24 - (long)ppDVar2);
      messageGenerator.field_generators_.field_generators_.
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&stack0xffffffffffffff90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)args_3,local_f0,
                 (pointer)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                          (long)local_f0));
      psVar3 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)psVar3,"oneof_index","");
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (key_type *)psVar3);
      std::__cxx11::string::operator=((string *)pmVar13,(string *)args_3);
      if ((size_type *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count != psVar1) {
        operator_delete((void *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      if (messageGenerator.field_generators_.field_generators_.
          super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffff90) {
        operator_delete(messageGenerator.field_generators_.field_generators_.
                        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      google::protobuf::io::Printer::Print
                ((map *)local_38,(char *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count
                );
      google::protobuf::io::Printer::Print
                ((map *)local_38,(char *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count
                );
      google::protobuf::io::Printer::Indent();
      if (0 < *(int *)(local_48 + 0x18)) {
        lVar24 = 0;
        do {
          plVar15 = *(long **)(*(long *)(local_48 + 0x20) + lVar24 * 8);
          local_240.text_ = "";
          if (*(char *)(plVar15[0xf] + 0x4e) != '\0') {
            local_240.text_ = "@java.lang.Deprecated ";
          }
          messageGenerator.field_generators_.field_generators_.
          super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&stack0xffffffffffffff90;
          lVar25 = *(long *)*plVar15;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)args_3,lVar25,((long *)*plVar15)[1] + lVar25);
          if (local_78 != 0) {
            lVar25 = 0;
            do {
              cVar4 = *(char *)((long)&((messageGenerator.field_generators_.field_generators_.
                                         super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                       super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                       .
                                       super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                                       ._M_head_impl + lVar25);
              if ((byte)(cVar4 + 0x9fU) < 0x1a) {
                *(char *)((long)&((messageGenerator.field_generators_.field_generators_.
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                 super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                 .
                                 super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                                 ._M_head_impl + lVar25) = cVar4 + -0x20;
              }
              lVar25 = lVar25 + 1;
            } while (local_78 != lVar25);
          }
          ppDVar2 = &messageGenerator.super_MessageGenerator.descriptor_;
          local_f0 = (undefined1  [8])ppDVar2;
          lVar25 = google::protobuf::FastInt32ToBufferLeft
                             (*(int *)((long)plVar15 + 0x44),(char *)ppDVar2);
          psVar3 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
          messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
               (_func_int **)(lVar25 - (long)ppDVar2);
          vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)psVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)psVar3,local_f0,
                     (pointer)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator
                              + (long)local_f0));
          io::Printer::
          Print<char[12],char_const*,char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                    (local_38,"$deprecation$$field_name$($field_number$),\n",
                     (char (*) [12])"deprecation",&local_240.text_,(char (*) [11])0x2b53d2,args_3,
                     (char (*) [13])"field_number",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3);
          if ((size_type *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count != psVar1) {
            operator_delete((void *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          if (messageGenerator.field_generators_.field_generators_.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage !=
              (pointer)&stack0xffffffffffffff90) {
            operator_delete(messageGenerator.field_generators_.field_generators_.
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 < *(int *)(local_48 + 0x18));
      }
      messageGenerator.field_generators_.field_generators_.
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&stack0xffffffffffffff90;
      std::__cxx11::string::_M_construct<char_const*>((string *)args_3,"oneof_name","");
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count,args_3);
      local_f0 = (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_;
      pcVar7 = (pmVar13->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f0,pcVar7,pcVar7 + pmVar13->_M_string_length);
      if (messageGenerator.super_MessageGenerator._vptr_MessageGenerator != (_func_int **)0x0) {
        pp_Var20 = (_func_int **)0x0;
        do {
          if ((byte)(*(char *)((long)local_f0 + (long)pp_Var20) + 0x9fU) < 0x1a) {
            *(char *)((long)local_f0 + (long)pp_Var20) =
                 *(char *)((long)local_f0 + (long)pp_Var20) + -0x20;
          }
          pp_Var20 = (_func_int **)((long)pp_Var20 + 1);
        } while (messageGenerator.super_MessageGenerator._vptr_MessageGenerator != pp_Var20);
      }
      io::Printer::Print<char[15],std::__cxx11::string>
                (local_38,"$cap_oneof_name$_NOT_SET(0);\n",(char (*) [15])"cap_oneof_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      if (local_f0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
        operator_delete((void *)local_f0);
      }
      if (messageGenerator.field_generators_.field_generators_.
          super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffff90) {
        operator_delete(messageGenerator.field_generators_.field_generators_.
                        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      google::protobuf::io::Printer::Print
                ((map *)local_38,(char *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count
                );
      google::protobuf::io::Printer::Print
                ((map *)local_38,(char *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count
                );
      if (0 < *(int *)(local_48 + 0x18)) {
        lVar24 = 0;
        do {
          plVar15 = *(long **)(*(long *)(local_48 + 0x20) + lVar24 * 8);
          ppDVar2 = &messageGenerator.super_MessageGenerator.descriptor_;
          local_1d0 = lVar24;
          local_f0 = (undefined1  [8])ppDVar2;
          lVar24 = google::protobuf::FastInt32ToBufferLeft
                             (*(int *)((long)plVar15 + 0x44),(char *)ppDVar2);
          messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
               (_func_int **)(lVar24 - (long)ppDVar2);
          messageGenerator.field_generators_.field_generators_.
          super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&stack0xffffffffffffff90;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)args_3,local_f0,
                     (pointer)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator
                              + (long)local_f0));
          plVar15 = (long *)*plVar15;
          lVar24 = *plVar15;
          vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)psVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,lVar24,
                     plVar15[1] + lVar24);
          if (CONCAT44(out_1._M_dataplus._M_p._4_4_,out_1._M_dataplus._M_p._0_4_) != 0) {
            lVar24 = 0;
            do {
              if ((byte)(*(char *)(vars._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar24) +
                        0x9fU) < 0x1a) {
                *(char *)(vars._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar24) =
                     *(char *)(vars._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar24) +
                     -0x20;
              }
              lVar24 = lVar24 + 1;
            } while (CONCAT44(out_1._M_dataplus._M_p._4_4_,out_1._M_dataplus._M_p._0_4_) != lVar24);
          }
          io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                    (local_38,"    case $field_number$: return $field_name$;\n",
                     (char (*) [13])"field_number",args_3,(char (*) [11])0x2b53d2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if ((size_type *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count != psVar1) {
            operator_delete((void *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          if (messageGenerator.field_generators_.field_generators_.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage !=
              (pointer)&stack0xffffffffffffff90) {
            operator_delete(messageGenerator.field_generators_.field_generators_.
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          lVar24 = local_1d0 + 1;
        } while (lVar24 < *(int *)(local_48 + 0x18));
      }
      messageGenerator.field_generators_.field_generators_.
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&stack0xffffffffffffff90;
      std::__cxx11::string::_M_construct<char_const*>((string *)args_3,"oneof_name","");
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count,args_3);
      local_f0 = (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_;
      pcVar7 = (pmVar13->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f0,pcVar7,pcVar7 + pmVar13->_M_string_length);
      if (messageGenerator.super_MessageGenerator._vptr_MessageGenerator != (_func_int **)0x0) {
        pp_Var20 = (_func_int **)0x0;
        do {
          if ((byte)(*(char *)((long)local_f0 + (long)pp_Var20) + 0x9fU) < 0x1a) {
            *(char *)((long)local_f0 + (long)pp_Var20) =
                 *(char *)((long)local_f0 + (long)pp_Var20) + -0x20;
          }
          pp_Var20 = (_func_int **)((long)pp_Var20 + 1);
        } while (messageGenerator.super_MessageGenerator._vptr_MessageGenerator != pp_Var20);
      }
      io::Printer::Print<char[15],std::__cxx11::string>
                (local_38,
                 "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
                 ,(char (*) [15])"cap_oneof_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      if (local_f0 != (undefined1  [8])&messageGenerator.super_MessageGenerator.descriptor_) {
        operator_delete((void *)local_f0);
      }
      if (messageGenerator.field_generators_.field_generators_.
          super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffff90) {
        operator_delete(messageGenerator.field_generators_.field_generators_.
                        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      google::protobuf::io::Printer::Outdent();
      io::Printer::Print<>(local_38,"};\n\n");
      google::protobuf::io::Printer::Print
                ((map *)local_38,(char *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count
                );
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_1c8);
    } while (p_Var16 != local_1c0);
  }
  pIVar19 = local_40;
  iVar11 = std::__cxx11::string::compare
                     (*(char **)((local_40->super_MessageGenerator).descriptor_ + 8));
  field = extraout_RDX_04;
  if (iVar11 == 0) {
    io::Printer::Print<>
              (local_38,
               "private static String getTypeUrl(\n    java.lang.String typeUrlPrefix,\n    com.google.protobuf.Descriptors.Descriptor descriptor) {\n  return typeUrlPrefix.endsWith(\"/\")\n      ? typeUrlPrefix + descriptor.getFullName()\n      : typeUrlPrefix + \"/\" + descriptor.getFullName();\n}\n\nprivate static String getTypeNameFromTypeUrl(\n    java.lang.String typeUrl) {\n  int pos = typeUrl.lastIndexOf(\'/\');\n  return pos == -1 ? \"\" : typeUrl.substring(pos + 1);\n}\n\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(\"type.googleapis.com\",\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\n/**\n * Packs a message using the given type URL prefix. The type URL will\n * be constructed by concatenating the message type\'s full name to the\n * prefix with an optional \"/\" separator if the prefix doesn\'t end\n * with \"/\" already.\n */\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message, java.lang.String typeUrlPrefix) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(typeUrlPrefix,\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\npublic <T extends com.google.protobuf.Message> boolean is(\n    java.lang.Class<T> clazz) {\n  T defaultInstance =\n      com.google.protobuf.Internal.getDefaultInstance(clazz);\n  return getTypeNameFromTypeUrl(getTypeUrl()).equals(\n      defaultInstance.getDescriptorForType().getFullName());\n}\n\nprivate volatile com.google.protobuf.Message cachedUnpackValue;\n\n@java.lang.SuppressWarnings(\"unchecked\")\npublic <T extends com.google.protobuf.Message> T unpack(\n    java.lang.Class<T> clazz)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  boolean invalidClazz = false;\n  if (cachedUnpackValue != null) {\n    if (cachedUnpackValue.getClass() == clazz) {\n      return (T) cachedUnpackValue;\n    }\n    invalidClazz = true;\n  }\n  if (invalidClazz || !is(clazz)) {\n    t..." /* TRUNCATED STRING LITERAL */
              );
    field = extraout_RDX_05;
  }
  pDVar18 = (pIVar19->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar18 + 0x68)) {
    lVar25 = 0;
    lVar24 = 0;
    do {
      FieldConstantName_abi_cxx11_
                ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (java *)(*(long *)(pDVar18 + 0x28) + lVar25),field);
      messageGenerator.field_generators_.field_generators_.
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&stack0xffffffffffffff90;
      lVar17 = google::protobuf::FastInt32ToBufferLeft
                         (*(int *)(*(long *)((local_40->super_MessageGenerator).descriptor_ + 0x28)
                                   + 0x44 + lVar25),(char *)&stack0xffffffffffffff90);
      local_240.text_ = local_240.scratch_ + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_240,
                 messageGenerator.field_generators_.field_generators_.
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (lVar17 - (long)&stack0xffffffffffffff90) +
                 (long)messageGenerator.field_generators_.field_generators_.
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
                (local_38,"public static final int $constant_name$ = $number$;\n",
                 (char (*) [14])0x2a340d,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &vars._M_t._M_impl.super__Rb_tree_header._M_node_count,(char (*) [7])0x2b54fb,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_240);
      if (local_240.text_ != local_240.scratch_ + 4) {
        operator_delete(local_240.text_);
      }
      if ((size_type *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count !=
          &out_1._M_string_length) {
        operator_delete((void *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      lVar17 = *(long *)((local_40->super_MessageGenerator).descriptor_ + 0x28);
      if (*(Descriptor **)(lVar17 + 0x50 + lVar25) != (local_40->field_generators_).descriptor_) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/compiler/java/java_field.h"
                   ,0x87);
        pLVar14 = (LogMessage *)
                  google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_f0,
                             "CHECK failed: (field->containing_type()) == (descriptor_): ");
        google::protobuf::internal::LogFinisher::operator=
                  ((LogFinisher *)
                   &messageGenerator.field_generators_.field_generators_.
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_f0);
      }
      if (*(char *)(lVar17 + 0x43 + lVar25) == '\0') {
        plVar15 = (long *)(*(long *)(lVar17 + 0x50 + lVar25) + 0x28);
      }
      else {
        lVar6 = *(long *)(lVar17 + 0x60 + lVar25);
        if (lVar6 == 0) {
          plVar15 = (long *)(*(long *)(lVar17 + 0x28 + lVar25) + 0x80);
        }
        else {
          plVar15 = (long *)(lVar6 + 0x50);
        }
      }
      _Var8._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
      _M_head_impl = (local_40->field_generators_).field_generators_.
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [(int)((ulong)((lVar17 - *plVar15) + lVar25) >> 3) * 0x286bca1b]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var8._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                            ._M_head_impl + 0x28))
                (_Var8._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                 ._M_head_impl,local_38);
      io::Printer::Print<>(local_38,"\n");
      lVar24 = lVar24 + 1;
      pDVar18 = (local_40->super_MessageGenerator).descriptor_;
      lVar25 = lVar25 + 0x98;
      field = extraout_RDX_06;
    } while (lVar24 < *(int *)(pDVar18 + 0x68));
  }
  pIVar19 = local_40;
  bVar10 = Context::HasGeneratedMethods(local_40->context_,pDVar18);
  if (bVar10) {
    GenerateIsInitialized(pIVar19,local_38);
    GenerateMessageSerializationMethods(pIVar19,local_38);
    GenerateEqualsAndHashCode(pIVar19,local_38);
  }
  GenerateParseFromMethods(pIVar19,local_38);
  GenerateBuilder(pIVar19,local_38);
  io::Printer::Print<char[10],std::__cxx11::string>
            (local_38,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n",
             (char (*) [10])0x29428f,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((pIVar19->super_MessageGenerator).descriptor_ + 8));
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)
             &messageGenerator.field_generators_.field_generators_.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pIVar19->name_resolver_,
             (pIVar19->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (local_38,"private static final $classname$ DEFAULT_INSTANCE;\n",(char (*) [10])0x29599a
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &messageGenerator.field_generators_.field_generators_.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (messageGenerator.field_generators_.field_generators_.
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffff90) {
    operator_delete(messageGenerator.field_generators_.field_generators_.
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)
             &messageGenerator.field_generators_.field_generators_.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_40->name_resolver_,
             (local_40->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (local_38,"static {\n  DEFAULT_INSTANCE = new $classname$();\n}\n\n",
             (char (*) [10])0x29599a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &messageGenerator.field_generators_.field_generators_.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (messageGenerator.field_generators_.field_generators_.
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffff90) {
    operator_delete(messageGenerator.field_generators_.field_generators_.
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)
             &messageGenerator.field_generators_.field_generators_.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_40->name_resolver_,
             (local_40->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (local_38,
             "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n",
             (char (*) [10])0x29599a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &messageGenerator.field_generators_.field_generators_.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (messageGenerator.field_generators_.field_generators_.
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffff90) {
    operator_delete(messageGenerator.field_generators_.field_generators_.
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  pIVar19 = local_40;
  iVar11 = std::__cxx11::string::compare
                     ((char *)**(undefined8 **)
                                ((local_40->super_MessageGenerator).descriptor_ + 0x10));
  if (iVar11 == 0) {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)
               &messageGenerator.field_generators_.field_generators_.
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pIVar19->name_resolver_,
               (pIVar19->super_MessageGenerator).descriptor_,true);
    type = GetJavaType(*(FieldDescriptor **)((pIVar19->super_MessageGenerator).descriptor_ + 0x28));
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)PrimitiveTypeName(type);
    io::Printer::Print<char[10],std::__cxx11::string,char[11],char_const*>
              (local_38,
               "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
               ,(char (*) [10])0x29599a,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator.field_generators_.field_generators_.
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [11])0x29bf43,
               (char **)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pIVar19 = local_40;
    if (messageGenerator.field_generators_.field_generators_.
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffff90) {
      operator_delete(messageGenerator.field_generators_.field_generators_.
                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pIVar19 = local_40;
    }
  }
  GenerateParser(pIVar19,local_38);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)
             &messageGenerator.field_generators_.field_generators_.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pIVar19->name_resolver_,
             (pIVar19->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (local_38,
             "@java.lang.Override\npublic $classname$ getDefaultInstanceForType() {\n  return DEFAULT_INSTANCE;\n}\n\n"
             ,(char (*) [10])0x29599a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &messageGenerator.field_generators_.field_generators_.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (messageGenerator.field_generators_.field_generators_.
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffff90) {
    operator_delete(messageGenerator.field_generators_.field_generators_.
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  pDVar18 = (local_40->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar18 + 0x80)) {
    lVar24 = 0;
    this_00 = (ImmutableExtensionGenerator *)
              &messageGenerator.field_generators_.field_generators_.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar25 = 0;
    do {
      ImmutableExtensionGenerator::ImmutableExtensionGenerator
                (this_00,(FieldDescriptor *)(*(long *)(pDVar18 + 0x50) + lVar24),local_40->context_)
      ;
      ImmutableExtensionGenerator::Generate(this_00,local_38);
      ImmutableExtensionGenerator::~ImmutableExtensionGenerator(this_00);
      lVar25 = lVar25 + 1;
      pDVar18 = (local_40->super_MessageGenerator).descriptor_;
      lVar24 = lVar24 + 0x98;
    } while (lVar25 < *(int *)(pDVar18 + 0x80));
  }
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>(local_38,"}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (local_210 != (undefined1  [8])&builder_type._M_string_length) {
    operator_delete((void *)local_210);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_180);
  return;
}

Assistant:

void ImmutableMessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<std::string, std::string> variables;
  variables["static"] = is_own_file ? "" : "static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["ver"] = GeneratedCodeVersionSuffix();
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);

  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(
        variables,
        "    com.google.protobuf.GeneratedMessage$ver$.ExtendableMessage<\n"
        "      $classname$> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_),
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(variables,
                   "    com.google.protobuf.GeneratedMessage$ver$ implements\n"
                   "    $extra_interfaces$\n"
                   "    $classname$OrBuilder {\n");
    builder_type =
        strings::Substitute("com.google.protobuf.GeneratedMessage$0.Builder<?>",
                         GeneratedCodeVersionSuffix());
  }
  printer->Print("private static final long serialVersionUID = 0L;\n");

  printer->Indent();
  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
      "// Use $classname$.newBuilder() to construct.\n"
      "private $classname$($buildertype$ builder) {\n"
      "  super(builder);\n"
      "}\n",
      "classname", descriptor_->name(), "buildertype", builder_type);
  printer->Print("private $classname$() {\n", "classname", descriptor_->name());
  printer->Indent();
  GenerateInitializers(printer);
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(variables,
                 "@java.lang.Override\n"
                 "@SuppressWarnings({\"unused\"})\n"
                 "protected java.lang.Object newInstance(\n"
                 "    UnusedPrivateParameter unused) {\n"
                 "  return new $classname$();\n"
                 "}\n"
                 "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public final com.google.protobuf.UnknownFieldSet\n"
      "getUnknownFields() {\n"
      "  return this.unknownFields;\n"
      "}\n");

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateParsingConstructor(printer);
  }

  GenerateDescriptorMethods(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i), true, context_).Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator messageGenerator(descriptor_->nested_type(i),
                                               context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  std::map<std::string, std::string> vars;
  for (auto oneof : oneofs_) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = StrCat((oneof)->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(
        vars,
        "public enum $oneof_capitalized_name$Case\n"
        // TODO(dweis): Remove EnumLite when we want to break compatibility with
        // 3.x users
        "    implements com.google.protobuf.Internal.EnumLite,\n"
        "        com.google.protobuf.AbstractMessage.InternalOneOfEnum {\n");
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print(
          "$deprecation$$field_name$($field_number$),\n", "deprecation",
          field->options().deprecated() ? "@java.lang.Deprecated " : "",
          "field_name", ToUpper(field->name()), "field_number",
          StrCat(field->number()));
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   ToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    printer->Print(
        vars,
        "/**\n"
        " * @param value The number of the enum to look for.\n"
        " * @return The enum associated with the given number.\n"
        " * @deprecated Use {@link #forNumber(int)} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
        "  return forNumber(value);\n"
        "}\n"
        "\n"
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", StrCat(field->number()),
                     "field_name", ToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "public $oneof_capitalized_name$Case\n"
                   "get$oneof_capitalized_name$Case() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n");
  }

  if (IsAnyMessage(descriptor_)) {
    GenerateAnyMethods(printer);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", StrCat(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateMessageSerializationMethods(printer);
    GenerateEqualsAndHashCode(printer);
  }


  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));
  printer->Print(
      "static {\n"
      "  DEFAULT_INSTANCE = new $classname$();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ getDefaultInstanceForType() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}